

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kg.c
# Opt level: O0

err_t kgChp(int argc,char **argv)

{
  err_t eVar1;
  bool_t bVar2;
  int iVar3;
  blob_t pvVar4;
  undefined8 *in_RSI;
  int in_EDI;
  octet *privkey;
  size_t len;
  cmd_pwd_t pwdout;
  cmd_pwd_t pwdin;
  cmd_pwd_t in_stack_00000030;
  err_t code;
  undefined4 in_stack_00000044;
  octet *in_stack_00000048;
  char *in_stack_ffffffffffffffb8;
  u32 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  char **in_stack_ffffffffffffffc8;
  int count;
  undefined8 uVar5;
  char *cmdline;
  undefined4 in_stack_ffffffffffffffe8;
  undefined8 *local_10;
  int local_8;
  
  cmdline = (char *)0x0;
  uVar5 = 0;
  eVar1 = cmdStDo(in_stack_ffffffffffffffc0);
  local_10 = in_RSI;
  local_8 = in_EDI;
  if (eVar1 != 0) {
    return eVar1;
  }
  do {
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 & 0xffffff;
    if (local_8 != 0) {
      bVar2 = strStartsWith((char *)*local_10,"-");
      in_stack_ffffffffffffffc4 = CONCAT13(bVar2 != 0,(int3)in_stack_ffffffffffffffc4);
    }
    count = (int)uVar5;
    if ((char)(in_stack_ffffffffffffffc4 >> 0x18) == '\0') goto LAB_0011352b;
    iVar3 = strCmp((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
    count = (int)uVar5;
    if (iVar3 == 0) {
      if (cmdline != (char *)0x0) {
        eVar1 = 0x25c;
LAB_0011352b:
        if (eVar1 == 0) {
          eVar1 = 0x25b;
        }
        if (eVar1 != 0) {
          cmdPwdClose((cmd_pwd_t)0x113562);
          cmdPwdClose((cmd_pwd_t)0x11356c);
          return eVar1;
        }
        eVar1 = cmdFileValExist(count,in_stack_ffffffffffffffc8);
        if (eVar1 != 0) {
          cmdPwdClose((cmd_pwd_t)0x11359d);
          cmdPwdClose((cmd_pwd_t)0x1135a7);
          return eVar1;
        }
        eVar1 = cmdPrivkeyRead(in_stack_00000048,(size_t *)CONCAT44(in_stack_00000044,argc),
                               (char *)argv,in_stack_00000030);
        if (eVar1 != 0) {
          cmdPwdClose((cmd_pwd_t)0x1135e4);
          cmdPwdClose((cmd_pwd_t)0x1135ee);
          return eVar1;
        }
        pvVar4 = blobCreate((size_t)in_stack_ffffffffffffffb8);
        eVar1 = 0x6e;
        if (pvVar4 != (blob_t)0x0) {
          eVar1 = 0;
        }
        if (eVar1 != 0) {
          cmdPwdClose((cmd_pwd_t)0x113630);
          cmdPwdClose((cmd_pwd_t)0x11363a);
          return eVar1;
        }
        eVar1 = cmdPrivkeyRead(in_stack_00000048,(size_t *)CONCAT44(in_stack_00000044,argc),
                               (char *)argv,in_stack_00000030);
        cmdPwdClose((cmd_pwd_t)0x113671);
        if (eVar1 != 0) {
          blobClose((blob_t)0x113682);
          cmdPwdClose((cmd_pwd_t)0x11368c);
          return eVar1;
        }
        eVar1 = cmdPrivkeyWrite((octet *)pwdin,(size_t)pwdout,(char *)len,(cmd_pwd_t)privkey);
        blobClose((blob_t)0x1136c0);
        cmdPwdClose((cmd_pwd_t)0x1136ca);
        return eVar1;
      }
      if (local_8 == 1) {
        eVar1 = 0x25b;
        goto LAB_0011352b;
      }
      eVar1 = cmdPwdRead((cmd_pwd_t *)CONCAT44(eVar1,in_stack_ffffffffffffffe8),(char *)0x0);
      count = (int)uVar5;
    }
    else {
      iVar3 = strCmp((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
      count = (int)uVar5;
      if (iVar3 != 0) {
        eVar1 = 0x25b;
        goto LAB_0011352b;
      }
      if (local_8 == 1) {
        eVar1 = 0x25b;
        goto LAB_0011352b;
      }
      eVar1 = cmdPwdRead((cmd_pwd_t *)CONCAT44(eVar1,in_stack_ffffffffffffffe8),cmdline);
      count = (int)uVar5;
    }
    if (eVar1 != 0) goto LAB_0011352b;
    local_8 = local_8 + -2;
    local_10 = local_10 + 2;
  } while( true );
}

Assistant:

static err_t kgChp(int argc, char* argv[])
{
	err_t code = ERR_OK;
	cmd_pwd_t pwdin = 0;
	cmd_pwd_t pwdout = 0;
	size_t len = 0;
	octet* privkey;
	// самотестирование
	code = cmdStDo(CMD_ST_BELS | CMD_ST_BELT);
	ERR_CALL_CHECK(code);
	// разбор опций
	while (argc && strStartsWith(*argv, "-"))
	{
		if (strEq(*argv, "-passin"))
		{
			if (pwdin)
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			++argv, --argc;
			if (!argc)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			code = cmdPwdRead(&pwdin, *argv);
			if (code != ERR_OK)
				break;
			ASSERT(cmdPwdIsValid(pwdin));
			++argv, --argc;
		}
		else if (strEq(*argv, "-passout"))
		{
			if (pwdout)
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			++argv, --argc;
			if (!argc)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			code = cmdPwdRead(&pwdout, *argv);
			if (code != ERR_OK)
				break;
			ASSERT(cmdPwdIsValid(pwdout));
			++argv, --argc;
		}
		else
		{
			code = ERR_CMD_PARAMS;
			break;
		}
	}
	if (code == ERR_OK && (!pwdin || !pwdout || argc != 1))
		code = ERR_CMD_PARAMS;
	ERR_CALL_HANDLE(code, (cmdPwdClose(pwdout), cmdPwdClose(pwdin)));
	// проверить файл-контейнер
	code = cmdFileValExist(1, argv);
	ERR_CALL_HANDLE(code, (cmdPwdClose(pwdout), cmdPwdClose(pwdin)));
	// определить длину личного ключа
	code = cmdPrivkeyRead(0, &len, argv[0], pwdin);
	ERR_CALL_HANDLE(code, (cmdPwdClose(pwdout), cmdPwdClose(pwdin)));
	// выделить память
	code = cmdBlobCreate(privkey, len);
	ERR_CALL_HANDLE(code, (cmdPwdClose(pwdout), cmdPwdClose(pwdin)));
	// читать личный ключ
	code = cmdPrivkeyRead(privkey, &len, argv[0], pwdin);
	cmdPwdClose(pwdin);
	ERR_CALL_HANDLE(code, (cmdBlobClose(privkey), cmdPwdClose(pwdout)));
	// сохранить личный ключ
	code = cmdPrivkeyWrite(privkey, len, argv[0], pwdout);
	cmdBlobClose(privkey);
	cmdPwdClose(pwdout);
	return code;
}